

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPo.c
# Opt level: O3

void Acec_PrintSignature(Vec_Wec_t *vMonos)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  
  printf("Output signature with %d monomials:\n",(ulong)(uint)vMonos->nSize);
  if (0 < vMonos->nSize) {
    lVar7 = 0;
    do {
      pVVar2 = vMonos->pArray;
      if ((long)pVVar2[lVar7].nSize < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
      }
      iVar1 = pVVar2[lVar7].pArray[(long)pVVar2[lVar7].nSize + -1];
      pcVar5 = "R,D tc;-R R5t* -Rt> t5*RD c>Rt- t;R,M t-RM; t;V,R V-tR; t5*lR l-t>R t5VR* -";
      if (0 < iVar1) {
        pcVar5 = "3jF j3&F Tj#3F &3sF 3(#F &3+F 3BF#( +a&3F 3F.#( +8&3F #(F.B3 8a&+3F 3FK#( +";
      }
      iVar3 = -iVar1;
      if (0 < iVar1) {
        iVar3 = iVar1;
      }
      printf("  %s2^%d",pcVar5 + 0x4a,(ulong)(iVar3 - 1));
      if (1 < pVVar2[lVar7].nSize) {
        lVar6 = 0;
        do {
          uVar4 = pVVar2[lVar7].pArray[lVar6];
          printf(" * ");
          if ((int)uVar4 < 0) {
            uVar4 = ~uVar4;
            pcVar5 = "i%d";
          }
          else {
            pcVar5 = "o%d";
          }
          printf(pcVar5,(ulong)uVar4);
          lVar6 = lVar6 + 1;
        } while (lVar6 < (long)pVVar2[lVar7].nSize + -1);
      }
      putchar(10);
      lVar7 = lVar7 + 1;
    } while (lVar7 < vMonos->nSize);
  }
  return;
}

Assistant:

void Acec_PrintSignature( Vec_Wec_t * vMonos )
{
    Vec_Int_t * vLevel; int i, k, Entry;
    printf( "Output signature with %d monomials:\n", Vec_WecSize(vMonos) );
    Vec_WecForEachLevel( vMonos, vLevel, i )
    {
        printf( "  %s2^%d", Vec_IntEntryLast(vLevel) > 0 ? "+":"-", Abc_AbsInt(Vec_IntEntryLast(vLevel))-1 );
        Vec_IntForEachEntryStop( vLevel, Entry, k, Vec_IntSize(vLevel)-1 )
        {
            printf( " * " );
            if ( Entry < 0 )
                printf( "i%d", -Entry-1 );
            else 
                printf( "o%d", Entry );
        }
        printf( "\n" );
    }
}